

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double pearson_05_sample(double a,double b,double c,int *seed)

{
  double dVar1;
  
  dVar1 = gamma_sample(0.0,b,1.0 / a,seed);
  return 1.0 / dVar1 + c;
}

Assistant:

double pearson_05_sample ( double a, double b, double c, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    PEARSON_05_SAMPLE samples the Pearson 5 PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < A, 0.0 < B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double PEARSON_05_SAMPLE, a sample of the PDF.
//
{
  double a2;
  double b2;
  double c2;
  double x;
  double x2;

  a2 = 0.0;
  b2 = b;
  c2 = 1.0 / a;

  x2 = gamma_sample ( a2, b2, c2, seed );

  x = c + 1.0 / x2;

  return x;
}